

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

string * __thiscall Quest::Name_abi_cxx11_(string *__return_storage_ptr__,Quest *this)

{
  Quest *pQVar1;
  pointer pcVar2;
  
  pQVar1 = this->quest;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pQVar1->info).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pQVar1->info).name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Quest::Name() const
{
	return this->quest->info.name;
}